

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O2

int32_t icu_63::appendUTF8(UChar *s,int32_t length,uint8_t *t,int32_t capacity)

{
  int32_t iVar1;
  int32_t length8;
  UErrorCode errorCode;
  int32_t local_10;
  UErrorCode local_c;
  
  local_c = U_ZERO_ERROR;
  local_10 = 0;
  u_strToUTF8_63((char *)t,capacity,&local_10,s,length,&local_c);
  iVar1 = 0;
  if (local_c < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = local_10;
  }
  return iVar1;
}

Assistant:

static int32_t
appendUTF8(const UChar *s, int32_t length, uint8_t *t, int32_t capacity) {
    UErrorCode errorCode=U_ZERO_ERROR;
    int32_t length8=0;
    u_strToUTF8((char *)t, capacity, &length8, s, length, &errorCode);
    if(U_SUCCESS(errorCode)) {
        return length8;
    } else {
        // The string contains an unpaired surrogate.
        // Ignore this string.
        return 0;
    }
}